

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O2

void __thiscall
Printer_printComponentWithMultipleMathDocuments_Test::TestBody
          (Printer_printComponentWithMultipleMathDocuments_Test *this)

{
  char *pcVar1;
  AssertHelper local_90 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  AssertionResult gtest_ar;
  ModelPtr model;
  ParserPtr parser;
  PrinterPtr printer;
  string e;
  
  libcellml::Printer::create();
  libcellml::Parser::create(SUB81(&parser,0));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"printer/component_with_multiple_math.cellml",
             (allocator<char> *)&model);
  fileContents((string *)&e);
  std::__cxx11::string::~string((string *)&local_88);
  libcellml::Parser::parseModel((string *)&model);
  libcellml::Printer::printModel_abi_cxx11_
            ((shared_ptr *)&local_88,
             (bool)printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   ._0_1_);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"e","printer->printModel(model)",&e,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_88);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/printer/printer.cpp"
               ,0x3de,pcVar1);
    testing::internal::AssertHelper::operator=(local_90,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_88);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&e);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  return;
}

Assistant:

TEST(Printer, printComponentWithMultipleMathDocuments)
{
    auto printer = libcellml::Printer::create();
    auto parser = libcellml::Parser::create();

    const std::string e = fileContents("printer/component_with_multiple_math.cellml");
    auto model = parser->parseModel(e);

    EXPECT_EQ(e, printer->printModel(model));
}